

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawSchema * __thiscall capnp::SchemaLoader::Impl::load(Impl *this,Reader *reader,bool isPlaceholder)

{
  Initializer *pIVar1;
  Impl *pIVar2;
  bool bVar3;
  bool bVar4;
  Maybe<capnp::_::RawSchema_*&> MVar5;
  RawSchema *schema;
  RawSchema **ppRVar6;
  uint16_t *puVar7;
  Which kind;
  uint64_t uVar8;
  Impl *pIVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ArrayPtr<capnp::word> AVar14;
  StringPtr name;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar15;
  Reader validatedReader;
  CompatibilityChecker checker;
  Reader existing;
  Validator validator;
  StructReader local_1e8;
  CompatibilityChecker local_1b8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_138;
  StructReader local_120;
  Validator local_f0;
  
  AVar14 = makeUncheckedNodeEnforcingSizeRequirements(this,(Reader)reader->_reader);
  Validator::Validator(&local_f0,this);
  local_1b8.loader = (Impl *)0x0;
  local_1b8.nodeName.super_StringPtr.content.ptr = (char *)0x0;
  local_1b8.existingNode._reader.segment._0_4_ = 0x7fffffff;
  local_1b8.nodeName.super_StringPtr.content.size_ = (size_t)AVar14.ptr;
  _::PointerReader::getStruct(&local_1e8,(PointerReader *)&local_1b8,(word *)0x0);
  bVar3 = Validator::validate(&local_f0,(Reader *)&local_1e8);
  if (!bVar3) {
    if (local_1e8.dataSize < 0x40) {
      uVar8 = 0;
    }
    else {
      uVar8 = *local_1e8.data;
    }
    bVar3 = local_1e8.pointerCount == 0;
    local_1b8.nodeName.super_StringPtr.content.size_ = (size_t)local_1e8.pointers;
    if (bVar3) {
      local_1b8.nodeName.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
    }
    local_1b8.existingNode._reader.segment._0_4_ = 0x7fffffff;
    if (!bVar3) {
      local_1b8.existingNode._reader.segment._0_4_ = local_1e8.nestingLimit;
    }
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    if (!bVar3) {
      uVar10 = local_1e8.segment._0_4_;
      uVar11 = local_1e8.segment._4_4_;
      uVar12 = local_1e8.capTable._0_4_;
      uVar13 = local_1e8.capTable._4_4_;
    }
    local_1b8.loader = (Impl *)CONCAT44(uVar11,uVar10);
    local_1b8.nodeName.super_StringPtr.content.ptr = (char *)CONCAT44(uVar13,uVar12);
    name.content = (ArrayPtr<const_char>)
                   _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1b8,(void *)0x0,0)
    ;
    if (local_1e8.dataSize < 0x70) {
      kind = FILE;
    }
    else {
      kind = *(Which *)((long)local_1e8.data + 0xc);
    }
    schema = loadEmpty(this,uVar8,name,kind,false);
    goto LAB_0015d8cb;
  }
  if (local_1e8.dataSize < 0x40) {
    local_1b8.loader = (Impl *)0x0;
  }
  else {
    local_1b8.loader = *local_1e8.data;
  }
  MVar5 = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::find<unsigned_long>
                    (&this->schemas,(unsigned_long *)&local_1b8);
  if (MVar5.ptr == (RawSchema **)0x0) {
    schema = (RawSchema *)kj::Arena::allocateBytes(&this->arena,0x70,8,false);
    (schema->defaultBrand).dependencies = (Dependency *)0x0;
    (schema->defaultBrand).scopeCount = 0;
    (schema->defaultBrand).dependencyCount = 0;
    (schema->defaultBrand).generic = (RawSchema *)0x0;
    (schema->defaultBrand).scopes = (Scope *)0x0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    if (local_1e8.dataSize < 0x40) {
      uVar8 = 0;
    }
    else {
      uVar8 = *local_1e8.data;
    }
    local_1b8.loader = (Impl *)0x0;
    pIVar9 = (Impl *)&this->brandedInitializer;
    pIVar2 = (Impl *)&this->initializer;
    if (!isPlaceholder) {
      pIVar9 = local_1b8.loader;
      pIVar2 = local_1b8.loader;
    }
    schema->id = uVar8;
    schema->canCastTo = (RawSchema *)0x0;
    (schema->defaultBrand).generic = schema;
    schema->lazyInitializer = (Initializer *)pIVar2;
    (schema->defaultBrand).lazyInitializer = (Initializer *)pIVar9;
    if (0x3f < local_1e8.dataSize) {
      local_1b8.loader = *local_1e8.data;
    }
    local_1b8.nodeName.super_StringPtr.content.ptr = (char *)schema;
    kj::
    Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
    ::insert(&(this->schemas).table,(Entry *)&local_1b8);
    bVar3 = false;
LAB_0015d848:
    schema->encodedNode = (word *)AVar14.ptr;
    schema->encodedSize = (uint32_t)AVar14.size_;
    ppRVar6 = Validator::makeDependencyArray(&local_f0,&schema->dependencyCount);
    schema->dependencies = ppRVar6;
    puVar7 = Validator::makeMemberInfoArray(&local_f0,&schema->memberCount);
    schema->membersByName = puVar7;
    schema->membersByDiscriminant = local_f0.membersByDiscriminant.ptr;
    local_138.ptr.field_1.value.ptr = (Scope *)0x0;
    local_138.ptr.field_1.value.size_ = 0;
    local_138.ptr.isSet = true;
    AVar15 = makeBrandedDependencies(this,schema,&local_138);
    (schema->defaultBrand).dependencies = AVar15.ptr;
    (schema->defaultBrand).dependencyCount = (uint32_t)AVar15.size_;
  }
  else {
    schema = *MVar5.ptr;
    pIVar1 = schema->lazyInitializer;
    local_1b8.nodeName.super_StringPtr.content.size_ = (size_t)schema->encodedNode;
    local_1b8.loader = (Impl *)0x0;
    local_1b8.nodeName.super_StringPtr.content.ptr = (char *)0x0;
    local_1b8.existingNode._reader.segment =
         (SegmentReader *)CONCAT44(local_1b8.existingNode._reader.segment._4_4_,0x7fffffff);
    _::PointerReader::getStruct(&local_120,(PointerReader *)&local_1b8,(word *)0x0);
    local_1b8.nodeName.super_StringPtr.content.ptr = "";
    local_1b8.nodeName.super_StringPtr.content.size_ = 1;
    local_1b8.existingNode._reader.segment._0_4_ = 0;
    local_1b8.existingNode._reader.segment._4_4_ = 0;
    local_1b8.existingNode._reader.capTable = (CapTableReader *)0x0;
    local_1b8.existingNode._reader.data = (void *)0x0;
    local_1b8.existingNode._reader.pointers._0_6_ = 0;
    local_1b8.existingNode._reader.pointers._6_2_ = 0;
    local_1b8.existingNode._reader.dataSize = 0;
    local_1b8.existingNode._reader.pointerCount = 0;
    local_1b8.existingNode._reader.nestingLimit = 0x7fffffff;
    local_1b8.replacementNode._reader.segment = (SegmentReader *)0x0;
    local_1b8.replacementNode._reader.capTable = (CapTableReader *)0x0;
    local_1b8.replacementNode._reader.data = (void *)0x0;
    local_1b8.replacementNode._reader.pointers._0_6_ = 0;
    local_1b8.replacementNode._reader.pointers._6_2_ = 0;
    local_1b8.replacementNode._reader.dataSize = 0;
    local_1b8.replacementNode._reader.pointerCount = 0;
    local_1b8.replacementNode._reader.nestingLimit = 0x7fffffff;
    local_1b8.loader = this;
    bVar4 = CompatibilityChecker::shouldReplace
                      (&local_1b8,(Reader *)&local_120,(Reader *)&local_1e8,
                       schema->lazyInitializer != (Initializer *)0x0);
    bVar3 = pIVar1 != (Initializer *)0x0 && !isPlaceholder;
    if (bVar4) goto LAB_0015d848;
  }
  if (bVar3) {
    schema->lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
  }
LAB_0015d8cb:
  Validator::~Validator(&local_f0);
  return schema;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::load(const schema::Node::Reader& reader, bool isPlaceholder) {
  // Make a copy of the node which can be used unchecked.
  kj::ArrayPtr<word> validated = makeUncheckedNodeEnforcingSizeRequirements(reader);

  // Validate the copy.
  Validator validator(*this);
  auto validatedReader = readMessageUnchecked<schema::Node>(validated.begin());

  if (!validator.validate(validatedReader)) {
    // Not valid.  Construct an empty schema of the same type and return that.
    return loadEmpty(validatedReader.getId(),
                     validatedReader.getDisplayName(),
                     validatedReader.which(),
                     false);
  }

  // Check if we already have a schema for this ID.
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_MAYBE(match, schemas.find(validatedReader.getId())) {
    // Yes, check if it is compatible and figure out which schema is newer.

    schema = *match;

    // If the existing schema is a placeholder, but we're upgrading it to a non-placeholder, we
    // need to clear the initializer later.
    shouldClearInitializer = schema->lazyInitializer != nullptr && !isPlaceholder;

    auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
    CompatibilityChecker checker(*this);

    // Prefer to replace the existing schema if the existing schema is a placeholder.  Otherwise,
    // prefer to keep the existing schema.
    shouldReplace = checker.shouldReplace(
        existing, validatedReader, schema->lazyInitializer != nullptr);
  } else {
    // Nope, allocate a new RawSchema.
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->id = validatedReader.getId();
    schema->canCastTo = nullptr;
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = isPlaceholder ? &initializer : nullptr;
    schema->defaultBrand.lazyInitializer = isPlaceholder ? &brandedInitializer : nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;
    schemas.insert(validatedReader.getId(), schema);
  }